

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  WhereLoop **ppWVar5;
  SrcList *pSVar6;
  ExprList *pOrderBy;
  ulong uVar7;
  byte bVar8;
  i8 iVar9;
  LogEst LVar10;
  short a;
  int iVar11;
  uint uVar12;
  int extraout_EAX;
  WherePath *pWVar13;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  bool bVar14;
  LogEst *pLVar15;
  WhereLoop ***pppWVar17;
  LogEst *pLVar18;
  long lVar19;
  WherePath *pWVar20;
  undefined6 in_register_00000032;
  WherePath *pWVar21;
  ulong uVar22;
  ulong uVar23;
  short sVar24;
  undefined4 uVar25;
  WhereLoop *pWVar26;
  ushort uVar27;
  sqlite3 *psVar28;
  uint uVar29;
  ushort *puVar30;
  Bitmask revMask;
  uint local_e8;
  Bitmask local_e0;
  uint local_d8;
  undefined4 local_d4;
  ulong local_d0;
  WhereLoop **local_c8;
  ulong local_c0;
  uint local_b4;
  undefined8 local_b0;
  LogEst *local_a8;
  WhereInfo *local_a0;
  WherePath *local_98;
  ulong local_90;
  sqlite3 *local_88;
  WherePath *local_80;
  ulong local_78;
  undefined4 local_6c;
  int local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  WherePath *local_58;
  Parse *local_50;
  ushort *local_48;
  LogEst *local_40;
  size_t local_38;
  WhereLoop **ppWVar16;
  
  local_b0 = CONCAT62(in_register_00000032,nRowEst);
  local_50 = pWInfo->pParse;
  psVar28 = local_50->db;
  bVar8 = pWInfo->nLevel;
  puVar30 = (ushort *)(ulong)bVar8;
  local_d0 = 1;
  if (1 < bVar8) {
    local_d0 = (ulong)((uint)(bVar8 != 2) * 5 + 5);
  }
  local_d8 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    local_d8 = pWInfo->pOrderBy->nExpr;
  }
  uVar29 = (uint)local_d0;
  lVar19 = (long)(int)local_d8;
  local_58 = (WherePath *)
             sqlite3DbMallocRawNN
                       (psVar28,(long)(int)((int)(lVar19 * 2) +
                                           ((uint)bVar8 * 8 + 0x20) * uVar29 * 2));
  if (local_58 == (WherePath *)0x0) {
    return 0;
  }
  uVar22 = (ulong)(uVar29 << 5);
  pWVar20 = (WherePath *)((long)&local_58->maskLoop + uVar22);
  puVar1 = (undefined8 *)((long)&local_58->nRow + uVar22);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&local_58->maskLoop + uVar22);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_c8 = (WhereLoop **)((long)&pWVar20->maskLoop + uVar22);
  iVar11 = uVar29 * 2 + 1;
  pppWVar17 = &local_58->aLoop;
  do {
    *pppWVar17 = local_c8;
    iVar11 = iVar11 + -1;
    local_c8 = (WhereLoop **)((long)local_c8 + (ulong)((uint)bVar8 * 8));
    pppWVar17 = pppWVar17 + 4;
  } while (1 < iVar11);
  if (local_d8 == 0) {
    local_c8 = (WhereLoop **)0x0;
  }
  else {
    memset(local_c8,0,lVar19 * 2);
    uVar29 = (uint)local_d0;
  }
  pLVar15 = (LogEst *)0x30;
  if (local_50->nQueryLoop < 0x30) {
    pLVar15 = (LogEst *)(ulong)local_50->nQueryLoop;
  }
  pWVar20->nRow = (LogEst)pLVar15;
  pLVar18 = (LogEst *)(ulong)local_d8;
  if (local_d8 != 0) {
    pLVar15 = (LogEst *)-(long)puVar30;
    pWVar20->isOrdered = -(puVar30 != (ushort *)0x0) | (byte)local_d8;
  }
  local_88 = psVar28;
  if (puVar30 == (ushort *)0x0) {
    uVar29 = 1;
  }
  else {
    local_68 = (int)local_b0 + -0x32;
    local_64 = 2;
    if (2 < uVar29) {
      local_64 = uVar29;
    }
    uVar29 = 1;
    local_a8 = (LogEst *)0x0;
    local_e8 = 0;
    uVar23 = 0;
    uVar22 = 0;
    pWVar13 = local_58;
    local_a0 = pWInfo;
    local_80 = pWVar20;
    local_48 = puVar30;
    do {
      local_98 = pWVar13;
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      else {
        local_38 = (long)local_a8 * 8;
        local_40 = &pWVar13[1].rUnsorted;
        local_b4 = 0;
        local_60 = (uint)local_a8 & 0xffff;
        pLVar15 = local_a8;
        pWVar20 = local_80;
        uVar12 = 0;
        local_5c = uVar29;
        do {
          uVar29 = uVar12;
          for (pWVar26 = pWInfo->pLoops; pWVar26 != (WhereLoop *)0x0; pWVar26 = pWVar26->pNextLoop)
          {
            bVar8 = pWVar20->isOrdered;
            local_e0 = 0;
            uVar3 = pWVar20->maskLoop;
            if ((((pWVar26->prereq & ~uVar3) == 0) &&
                (uVar4 = pWVar26->maskSelf, (uVar4 & uVar3) == 0)) &&
               (((pWVar26->wsFlags & 0x4000) == 0 || (2 < pWVar20->nRow)))) {
              local_c0 = CONCAT44(local_c0._4_4_,uVar29);
              sVar24 = pWVar20->nRow;
              local_90 = uVar22;
              local_78 = uVar23;
              LVar10 = sqlite3LogEstAdd(pWVar26->rSetup,pWVar26->rRun + sVar24);
              a = sqlite3LogEstAdd(LVar10,pWVar20->rUnsorted);
              uVar27 = sVar24 + pWVar26->nOut;
              if ((char)bVar8 < '\0') {
                bVar8 = wherePathSatisfiesOrderBy
                                  (local_a0,local_a0->pOrderBy,pWVar20,local_a0->wctrlFlags,
                                   (u16)local_60,pWVar26,&local_e0);
              }
              else {
                local_e0 = pWVar20->revLoop;
              }
              uVar7 = local_c0;
              uVar29 = (uint)local_c0;
              iVar11 = local_d8 - (int)(char)bVar8;
              bVar14 = (iVar11 == 0 || (int)local_d8 < (int)(char)bVar8) || (char)bVar8 < '\0';
              ppWVar16 = (WhereLoop **)(ulong)CONCAT31((char)bVar8 >> 7,bVar14);
              uVar25 = (undefined4)CONCAT62(extraout_var,a);
              if (bVar14) {
                sVar24 = a + -2;
              }
              else {
                uVar22 = (ulong)bVar8;
                local_d4 = uVar25;
                if (*(short *)((long)local_c8 + uVar22 * 2) == 0) {
                  local_c0 = uVar22;
                  LVar10 = sqlite3LogEst((long)((iVar11 * 100) / (int)local_d8));
                  uVar25 = (undefined4)CONCAT62(extraout_var_00,LVar10);
                  uVar12 = (uint)local_b0;
                  if (((local_a0->wctrlFlags & 0x4000) != 0) &&
                     (uVar12 = *(uint *)&local_a0->iLimit,
                     (short)local_b0 <= (short)*(uint *)&local_a0->iLimit)) {
                    uVar12 = (uint)local_b0;
                  }
                  if ((short)uVar12 < 0xb) {
                    sVar24 = 0;
                  }
                  else {
                    local_6c = uVar25;
                    LVar10 = sqlite3LogEst((ulong)(uVar12 & 0xffff));
                    sVar24 = LVar10 + -0x21;
                    uVar25 = local_6c;
                  }
                  a = (short)local_d4;
                  *(short *)((long)local_c8 + local_c0 * 2) =
                       sVar24 + (short)local_68 + (short)uVar25;
                  uVar22 = local_c0;
                }
                ppWVar16 = local_c8;
                LVar10 = sqlite3LogEstAdd(a,*(LogEst *)((long)local_c8 + uVar22 * 2));
                sVar24 = (short)local_d4;
                a = LVar10 + 5;
              }
              pLVar15 = (LogEst *)CONCAT71((int7)((ulong)ppWVar16 >> 8),0 < (int)uVar29);
              iVar11 = (int)local_d0;
              uVar22 = local_90;
              uVar23 = local_78;
              if (0 < (int)uVar29) {
                pWVar13 = local_98;
                uVar12 = 1;
                do {
                  if ((pWVar13->maskLoop == (uVar4 | uVar3)) &&
                     (-1 < (char)(pWVar13->isOrdered ^ bVar8))) {
                    if ((char)pLVar15 != '\0') {
                      if (pWVar13->rCost < a) goto LAB_0017b395;
                      if (pWVar13->rCost != a) goto LAB_0017b599;
                      pLVar15 = (LogEst *)(ulong)uVar27;
                      if ((pWVar13->nRow < (short)uVar27) ||
                         ((pWVar13->nRow == uVar27 && (pWVar13->rUnsorted <= sVar24))))
                      goto LAB_0017b395;
                      goto LAB_0017b599;
                    }
                    break;
                  }
                  pWVar13 = pWVar13 + 1;
                  pLVar15 = (LogEst *)
                            CONCAT71((int7)((ulong)pLVar15 >> 8),(int)uVar12 < (int)uVar29);
                  bVar14 = uVar12 != uVar29;
                  uVar12 = uVar12 + 1;
                } while (bVar14);
              }
              uVar12 = uVar29;
              if (((int)uVar29 < iVar11) ||
                 ((pLVar15 = (LogEst *)(uVar7 & 0xffffffff), a <= (short)local_78 &&
                  ((uVar12 = local_e8, a != (short)local_78 ||
                   (pLVar15 = (LogEst *)(ulong)local_e8, sVar24 < (short)local_90)))))) {
                uVar29 = uVar29 + ((int)uVar29 < iVar11);
                pWVar13 = local_98 + (int)uVar12;
LAB_0017b599:
                pWVar13->maskLoop = pWVar26->maskSelf | pWVar20->maskLoop;
                pWVar13->revLoop = local_e0;
                pWVar13->nRow = uVar27;
                pWVar13->rCost = a;
                pWVar13->rUnsorted = sVar24;
                pWVar13->isOrdered = bVar8;
                memcpy(pWVar13->aLoop,pWVar20->aLoop,local_38);
                pWVar13->aLoop[(long)local_a8] = pWVar26;
                pLVar15 = local_a8;
                uVar22 = local_90;
                uVar23 = local_78;
                if (iVar11 <= (int)uVar29) {
                  local_e8 = 0;
                  uVar22 = (ulong)(ushort)local_98->nRow;
                  uVar23 = (ulong)(ushort)local_98->rCost;
                  if (1 < (byte)local_48) {
                    local_e8 = 0;
                    uVar12 = 1;
                    pLVar15 = local_40;
                    do {
                      uVar27 = pLVar15[-1];
                      if (((short)(ushort)uVar23 < (short)uVar27) ||
                         ((uVar27 == (ushort)uVar23 && ((short)uVar22 < *pLVar15)))) {
                        uVar22 = (ulong)(ushort)*pLVar15;
                        uVar23 = (ulong)uVar27;
                        local_e8 = uVar12;
                      }
                      uVar12 = uVar12 + 1;
                      pLVar15 = pLVar15 + 0x10;
                    } while (local_64 != uVar12);
                  }
                }
              }
            }
LAB_0017b395:
          }
          local_b4 = local_b4 + 1;
          pWVar20 = pWVar20 + 1;
          pWInfo = local_a0;
          uVar12 = uVar29;
        } while (local_b4 != local_5c);
      }
      pWVar13 = local_80;
      pLVar18 = (LogEst *)((long)local_a8 + 1);
      local_80 = local_98;
      pWVar20 = local_98;
      puVar30 = local_48;
      local_a8 = pLVar18;
    } while ((ushort *)pLVar18 != local_48);
  }
  psVar28 = local_88;
  if (uVar29 == 0) {
    sqlite3ErrorMsg(local_50,"no query solution",pLVar18,pLVar15);
    psVar28 = local_88;
  }
  else {
    if (1 < (int)uVar29) {
      lVar19 = (ulong)uVar29 - 1;
      pWVar21 = pWVar20;
      pWVar13 = pWVar20;
      do {
        pWVar20 = pWVar13 + 1;
        if (pWVar21->rCost <= pWVar13[1].rCost) {
          pWVar20 = pWVar21;
        }
        lVar19 = lVar19 + -1;
        pWVar21 = pWVar20;
        pWVar13 = pWVar13 + 1;
      } while (lVar19 != 0);
    }
    if (puVar30 != (ushort *)0x0) {
      ppWVar5 = pWVar20->aLoop;
      pSVar6 = pWInfo->pTabList;
      ppWVar16 = &pWInfo->a[0].pWLoop;
      uVar22 = 0;
      do {
        pWVar26 = ppWVar5[uVar22];
        *ppWVar16 = pWVar26;
        bVar8 = pWVar26->iTab;
        *(byte *)((long)ppWVar16 + -0x1c) = bVar8;
        *(int *)((long)ppWVar16 + -0x44) = pSVar6->a[bVar8].iCursor;
        uVar22 = uVar22 + 1;
        ppWVar16 = ppWVar16 + 0xb;
      } while (((ulong)puVar30 & 0xffffffff) != uVar22);
    }
    if (((((pWInfo->wctrlFlags & 0x180) == 0x100) && ((short)local_b0 != 0)) &&
        (pWInfo->eDistinct == '\0')) &&
       (iVar9 = wherePathSatisfiesOrderBy
                          (pWInfo,pWInfo->pResultSet,pWVar20,0x80,(short)puVar30 - 1,
                           pWVar20->aLoop[(long)puVar30 + -1],&local_e0),
       pWInfo->pResultSet->nExpr == (int)iVar9)) {
      pWInfo->eDistinct = '\x02';
    }
    pWInfo->bOrderedInnerLoop = '\0';
    pOrderBy = pWInfo->pOrderBy;
    if (pOrderBy != (ExprList *)0x0) {
      cVar2 = pWVar20->isOrdered;
      if ((pWInfo->wctrlFlags & 0x80) == 0) {
        pWInfo->nOBSat = cVar2;
        pWInfo->revMask = pWVar20->revLoop;
        if ((cVar2 < '\x01') && (pWInfo->nOBSat = '\0', puVar30 != (ushort *)0x0)) {
          uVar12 = (int)puVar30 - 1;
          uVar29 = pWVar20->aLoop[uVar12]->wsFlags;
          if ((~uVar29 & 0x104) != 0 && (uVar29 >> 0xc & 1) == 0) {
            local_e0 = 0;
            iVar9 = wherePathSatisfiesOrderBy
                              (pWInfo,pOrderBy,pWVar20,0x800,(u16)uVar12,pWVar20->aLoop[uVar12],
                               &local_e0);
            if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
              pWInfo->bOrderedInnerLoop = '\x01';
              pWInfo->revMask = local_e0;
            }
          }
        }
      }
      else if (pOrderBy->nExpr == (int)cVar2) {
        pWInfo->eDistinct = '\x02';
      }
      if ((((pWInfo->wctrlFlags & 0x200) != 0) && (puVar30 != (ushort *)0x0)) &&
         (pWInfo->pOrderBy->nExpr == (int)pWInfo->nOBSat)) {
        local_e0 = 0;
        uVar29 = (int)puVar30 - 1;
        iVar9 = wherePathSatisfiesOrderBy
                          (pWInfo,pWInfo->pOrderBy,pWVar20,0,(u16)uVar29,pWVar20->aLoop[uVar29],
                           &local_e0);
        if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
          pWInfo->sorted = '\x01';
          pWInfo->revMask = local_e0;
        }
      }
    }
    pWInfo->nRowOut = pWVar20->nRow;
  }
  sqlite3DbFreeNN(psVar28,local_58);
  return extraout_EAX;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  sqlite3 *db;              /* The database connection */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  db = pParse->db;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d)\n", nRowEst));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3DbMallocRawNN(db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array 
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered, 
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered = pFrom->isOrdered;  /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask = 0;              /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop. 
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        if( isOrdered<0 ){
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (5) to sorting as an
          ** extra encouragment to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 5;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy, 
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          ** 
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost 
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost 
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted) 
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3DbFreeNN(db, pSpace);
    return SQLITE_ERROR;
  }
  
  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
    }else{
      pWInfo->nOBSat = pFrom->isOrdered;
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0 
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, 
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }


  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3DbFreeNN(db, pSpace);
  return SQLITE_OK;
}